

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

int mbedtls_ssl_check_pending(mbedtls_ssl_context *ssl)

{
  int line;
  char *format;
  
  if (ssl->keep_current_message == 1) {
    format = "ssl_check_pending: record held back for processing";
    line = 0x14d7;
  }
  else if ((ssl->conf->transport == '\x01') && (ssl->next_record_offset < ssl->in_left)) {
    format = "ssl_check_pending: more records within current datagram";
    line = 0x14e2;
  }
  else if ((ssl->in_hslen == 0) || (ssl->in_msglen <= ssl->in_hslen)) {
    if (ssl->in_offt == (uchar *)0x0) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x14ff,"ssl_check_pending: nothing pending");
      return 0;
    }
    format = "ssl_check_pending: application data record is being processed";
    line = 0x14f5;
  }
  else {
    format = "ssl_check_pending: more handshake messages within current record";
    line = 0x14ed;
  }
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,line,format);
  return 1;
}

Assistant:

int mbedtls_ssl_check_pending(const mbedtls_ssl_context *ssl)
{
    /*
     * Case A: We're currently holding back
     * a message for further processing.
     */

    if (ssl->keep_current_message == 1) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("ssl_check_pending: record held back for processing"));
        return 1;
    }

    /*
     * Case B: Further records are pending in the current datagram.
     */

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->in_left > ssl->next_record_offset) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("ssl_check_pending: more records within current datagram"));
        return 1;
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    /*
     * Case C: A handshake message is being processed.
     */

    if (ssl->in_hslen > 0 && ssl->in_hslen < ssl->in_msglen) {
        MBEDTLS_SSL_DEBUG_MSG(3,
                              ("ssl_check_pending: more handshake messages within current record"));
        return 1;
    }

    /*
     * Case D: An application data message is being processed
     */
    if (ssl->in_offt != NULL) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("ssl_check_pending: application data record is being processed"));
        return 1;
    }

    /*
     * In all other cases, the rest of the message can be dropped.
     * As in ssl_get_next_record, this needs to be adapted if
     * we implement support for multiple alerts in single records.
     */

    MBEDTLS_SSL_DEBUG_MSG(3, ("ssl_check_pending: nothing pending"));
    return 0;
}